

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry_creation.cpp
# Opt level: O3

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::createGridSphere
          (SceneGraph *this,Vec3fa *center,float radius,size_t N,
          Ref<embree::SceneGraph::MaterialNode> *material)

{
  pointer *ppGVar1;
  undefined8 *puVar2;
  float *pfVar3;
  undefined8 *puVar4;
  pointer pvVar5;
  Vec3fa *ptr;
  iterator __position;
  undefined8 uVar6;
  GridMeshNode *this_00;
  Vec3fa *pVVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar24;
  float fVar25;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar26;
  float fVar27;
  Grid local_7c;
  Ref<embree::SceneGraph::MaterialNode> local_70;
  Node *local_68;
  GridMeshNode *local_60;
  long local_58;
  long local_50;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  long local_38;
  
  local_68 = (Node *)this;
  local_48 = radius;
  this_00 = (GridMeshNode *)operator_new(0xa8);
  local_70 = (Ref<embree::SceneGraph::MaterialNode>)material->ptr;
  local_60 = this_00;
  if (local_70.ptr != (MaterialNode *)0x0) {
    (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[2])();
  }
  GridMeshNode::GridMeshNode(this_00,&local_70,(BBox1f)0x3f80000000000000,1);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  if (local_70.ptr != (MaterialNode *)0x0) {
    (*((local_70.ptr)->super_Node).super_RefCount._vptr_RefCount[3])();
  }
  local_50 = N + 1;
  local_58 = local_50 * local_50;
  pvVar5 = (this_00->positions).
           super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar10 = local_58 * 6;
  uVar15 = pvVar5->size_alloced;
  uVar13 = uVar15;
  if ((uVar15 < uVar10) && (uVar13 = uVar10, uVar12 = uVar15, uVar15 != 0)) {
    do {
      uVar13 = uVar12 * 2 + (ulong)(uVar12 * 2 == 0);
      uVar12 = uVar13;
    } while (uVar13 < uVar10);
  }
  if (uVar10 < pvVar5->size_active) {
    pvVar5->size_active = uVar10;
  }
  if (uVar15 == uVar13) {
    pvVar5->size_active = uVar10;
  }
  else {
    ptr = pvVar5->items;
    pVVar7 = (Vec3fa *)alignedMalloc(uVar13 << 4,0x10);
    pvVar5->items = pVVar7;
    if (pvVar5->size_active != 0) {
      lVar8 = 0;
      uVar15 = 0;
      do {
        puVar4 = (undefined8 *)((long)&ptr->field_0 + lVar8);
        uVar6 = puVar4[1];
        puVar2 = (undefined8 *)((long)&pvVar5->items->field_0 + lVar8);
        *puVar2 = *puVar4;
        puVar2[1] = uVar6;
        uVar15 = uVar15 + 1;
        lVar8 = lVar8 + 0x10;
      } while (uVar15 < pvVar5->size_active);
    }
    alignedFree(ptr);
    pvVar5->size_active = uVar10;
    pvVar5->size_alloced = uVar13;
  }
  local_60 = (GridMeshNode *)&local_60->grids;
  fStack_44 = local_48;
  fStack_40 = local_48;
  fStack_3c = local_48;
  uVar15 = local_50 + (ulong)(local_50 == 0);
  local_38 = local_58 << 4;
  lVar8 = 0;
  lVar14 = 0;
  do {
    local_7c.startVtx = (int)lVar14 * (int)local_58;
    local_7c.lineStride = (uint)local_50;
    local_7c.resY = (unsigned_short)local_50;
    local_7c.resX = local_7c.resY;
    __position._M_current =
         (this_00->grids).
         super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this_00->grids).
        super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
      ::_M_realloc_insert<embree::SceneGraph::GridMeshNode::Grid>
                ((vector<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                  *)local_60,__position,&local_7c);
    }
    else {
      (__position._M_current)->resX = local_7c.resY;
      (__position._M_current)->resY = local_7c.resY;
      (__position._M_current)->startVtx = local_7c.startVtx;
      (__position._M_current)->lineStride = local_7c.lineStride;
      ppGVar1 = &(this_00->grids).
                 super__Vector_base<embree::SceneGraph::GridMeshNode::Grid,_std::allocator<embree::SceneGraph::GridMeshNode::Grid>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppGVar1 = *ppGVar1 + 1;
    }
    uVar10 = 0;
    lVar9 = lVar8;
    do {
      fVar16 = (float)uVar10 / (float)N;
      uVar13 = 0;
      lVar11 = lVar9;
      do {
        fVar17 = (float)uVar13 / (float)N;
        fVar18 = fVar17 * 1.0 + -0.5 + fVar16 * 0.0;
        fVar19 = fVar17 * 0.0 + -0.5 + fVar16 * 1.0;
        fVar20 = fVar17 * 0.0 + -0.5 + fVar16 * 0.0;
        fVar21 = fVar17 * 0.0 + 0.0 + fVar16 * 0.0;
        fVar17 = fVar19 * fVar19;
        fVar24 = fVar20 * fVar20;
        fVar25 = fVar21 * fVar21;
        fVar26 = fVar17 + fVar18 * fVar18 + fVar24;
        fVar27 = fVar17 + fVar17 + fVar25;
        fVar24 = fVar17 + fVar24 + fVar24;
        fVar25 = fVar17 + fVar25 + fVar25;
        auVar22._4_4_ = fVar27;
        auVar22._0_4_ = fVar26;
        auVar22._8_4_ = fVar24;
        auVar22._12_4_ = fVar25;
        auVar23._4_4_ = fVar27;
        auVar23._0_4_ = fVar26;
        auVar23._8_4_ = fVar24;
        auVar23._12_4_ = fVar25;
        auVar23 = rsqrtss(auVar22,auVar23);
        fVar17 = auVar23._0_4_;
        fVar26 = fVar17 * fVar17 * fVar26 * -0.5 * fVar17 + fVar17 * 1.5;
        fVar17 = (center->field_0).m128[1];
        fVar24 = (center->field_0).m128[2];
        fVar25 = (center->field_0).m128[3];
        pfVar3 = (float *)((long)&((this_00->positions).
                                   super__Vector_base<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>,_std::allocator<embree::vector_t<embree::Vec3fa,_embree::aligned_allocator<embree::Vec3fa,_16UL>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->items->field_0 +
                          lVar11);
        *pfVar3 = fVar26 * fVar18 * local_48 + (center->field_0).m128[0];
        pfVar3[1] = fVar26 * fVar19 * fStack_44 + fVar17;
        pfVar3[2] = fVar26 * fVar20 * fStack_40 + fVar24;
        pfVar3[3] = fVar26 * fVar21 * fStack_3c + fVar25;
        uVar13 = uVar13 + 1;
        lVar11 = lVar11 + 0x10;
      } while (uVar15 != uVar13);
      uVar10 = uVar10 + 1;
      lVar9 = lVar9 + N * 0x10 + 0x10;
    } while (uVar10 != uVar15);
    lVar14 = lVar14 + 1;
    lVar8 = lVar8 + local_38;
  } while (lVar14 != 6);
  (local_68->super_RefCount)._vptr_RefCount = (_func_int **)this_00;
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[2])(this_00);
  (*(this_00->super_Node).super_RefCount._vptr_RefCount[3])(this_00);
  return (Ref<embree::SceneGraph::Node>)local_68;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::createGridSphere (const Vec3fa& center, const float radius, size_t N, Ref<MaterialNode> material)
  {
    size_t grid_size = (N+1)*(N+1);
    Ref<SceneGraph::GridMeshNode> mesh = new SceneGraph::GridMeshNode(material,BBox1f(0,1),1);
    mesh->positions[0].resize(grid_size*6);

    for (size_t i=0; i<6; i++)
    {
      mesh->grids.push_back(SceneGraph::GridMeshNode::Grid(unsigned(i*grid_size),unsigned(N+1),unsigned(N+1),unsigned(N+1)));
      Vec3fa p0, dx, dy;
      switch (i) {
      case 0: p0 = Vec3fa(-0.5f,-0.5f,-0.5f); dx = Vec3fa(+1,0, 0); dy = Vec3fa(0,1,0); break;
      case 1: p0 = Vec3fa(+0.5f,-0.5f,-0.5f); dx = Vec3fa( 0,0,+1); dy = Vec3fa(0,1,0); break;
      case 2: p0 = Vec3fa(+0.5f,-0.5f,+0.5f); dx = Vec3fa(-1,0, 0); dy = Vec3fa(0,1,0); break;
      case 3: p0 = Vec3fa(-0.5f,-0.5f,+0.5f); dx = Vec3fa( 0,0,-1); dy = Vec3fa(0,1,0); break;
      case 4: p0 = Vec3fa(-0.5f,-0.5f,-0.5f); dx = Vec3fa( 0,0,+1); dy = Vec3fa(1,0,0); break;
      case 5: p0 = Vec3fa(-0.5f,+0.5f,-0.5f); dx = Vec3fa( 1,0, 0); dy = Vec3fa(0,0,1); break;
      default: assert(false);
      }
      
      for (size_t y=0; y<=N; y++) {
        for (size_t x=0; x<=N; x++) {
          size_t j = i*grid_size + y*(N+1) + x;
          Vec3fa p = p0+float(x)/float(N)*dx+float(y)/float(N)*dy;
          mesh->positions[0][j] = center + radius*normalize(p);
        }
      }
    }
    return mesh.dynamicCast<SceneGraph::Node>();
  }